

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O3

BaseExc * __thiscall Iex_3_4::BaseExc::assign(BaseExc *this,stringstream *s)

{
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->_message,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return this;
}

Assistant:

BaseExc&
BaseExc::assign (std::stringstream& s)
{
    _message.assign (s.str ());
    return *this;
}